

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

void __thiscall
node::BlockManager::UnlinkPrunedFiles
          (BlockManager *this,set<int,_std::less<int>,_std::allocator<int>_> *setFilesToPrune)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  Logger *this_00;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  FlatFilePos pos;
  error_code ec;
  path local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  p_Var4 = (setFilesToPrune->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(setFilesToPrune->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var5) {
    do {
      pos.nFile = p_Var4[1]._M_color;
      pos.nPos = 0;
      FlatFileSeq::FileName((path *)&local_60,&this->m_block_file_seq,&pos);
      cVar1 = std::filesystem::remove((path *)&local_60,&ec);
      std::filesystem::__cxx11::path::~path(&local_60);
      FlatFileSeq::FileName((path *)&local_60,&this->m_undo_file_seq,&pos);
      cVar2 = std::filesystem::remove((path *)&local_60,&ec);
      std::filesystem::__cxx11::path::~path(&local_60);
      if ((cVar1 != '\0') || (cVar2 != '\0')) {
        this_00 = LogInstance();
        bVar3 = BCLog::Logger::WillLogCategoryLevel(this_00,BLOCKSTORAGE,Debug);
        if (bVar3) {
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
          ;
          source_file._M_len = 0x65;
          logging_function._M_str = "UnlinkPrunedFiles";
          logging_function._M_len = 0x11;
          LogPrintFormatInternal<char[18],int>
                    (logging_function,source_file,0x32b,BLOCKSTORAGE,Debug,
                     (ConstevalFormatString<2U>)0xf7e782,(char (*) [18])"UnlinkPrunedFiles",
                     (int *)(p_Var4 + 1));
        }
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BlockManager::UnlinkPrunedFiles(const std::set<int>& setFilesToPrune) const
{
    std::error_code ec;
    for (std::set<int>::iterator it = setFilesToPrune.begin(); it != setFilesToPrune.end(); ++it) {
        FlatFilePos pos(*it, 0);
        const bool removed_blockfile{fs::remove(m_block_file_seq.FileName(pos), ec)};
        const bool removed_undofile{fs::remove(m_undo_file_seq.FileName(pos), ec)};
        if (removed_blockfile || removed_undofile) {
            LogDebug(BCLog::BLOCKSTORAGE, "Prune: %s deleted blk/rev (%05u)\n", __func__, *it);
        }
    }
}